

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O2

bool __thiscall axl::io::ShmtBase::initializeMapping(ShmtBase *this,size_t size,bool isForced)

{
  File *this_00;
  bool bVar1;
  int iVar2;
  Module *pMVar3;
  uint64_t uVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_40;
  ShmtFileHdr *pSVar5;
  
  pMVar3 = g::getModule();
  uVar7 = (pMVar3->m_systemInfo).m_pageSize;
  uVar6 = size % uVar7;
  uVar7 = (uVar7 + size) - uVar6;
  if (uVar6 == 0) {
    uVar7 = size;
  }
  this_00 = &this->m_file;
  if ((int)CONCAT71(in_register_00000011,isForced) == 0) {
    uVar4 = psx::File::getSize(&this_00->m_file);
    if (uVar4 < uVar7) {
      err::ErrorRef::ErrorRef((ErrorRef *)&local_40,0x16);
      err::setError((ErrorRef *)&local_40);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_40);
      return false;
    }
  }
  else {
    bVar1 = psx::File::setSize(&this_00->m_file,uVar7);
    if (!bVar1) {
      return false;
    }
  }
  iVar2 = Mapping::open(&this->m_mapping,(char *)this_00,0,uVar7,0);
  pSVar5 = (ShmtFileHdr *)CONCAT44(extraout_var,iVar2);
  if (pSVar5 != (ShmtFileHdr *)0x0) {
    this->m_hdr = pSVar5;
    this->m_data = (char *)(pSVar5 + 1);
  }
  return pSVar5 != (ShmtFileHdr *)0x0;
}

Assistant:

bool
ShmtBase::initializeMapping(
	size_t size,
	bool isForced
) {
	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	size_t remSize = size % systemInfo->m_pageSize;
	if (remSize)
		size = size - remSize + systemInfo->m_pageSize;

	if (isForced) {
		bool result = m_file.setSize(size);
		if (!result)
			return false;
	} else {
		uint64_t fileSize = m_file.getSize();
		if (fileSize < size) {
			err::setError(err::SystemErrorCode_InvalidParameter);
			return false;
		}
	}

	void* p = m_mapping.open(&m_file, 0, size);
	if (!p)
		return false;

	m_hdr = (ShmtFileHdr*)p;
	m_data = (char*)(m_hdr + 1);
	return true;
}